

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O1

BN * __thiscall BN::operator++(BN *this)

{
  unsigned_short uVar1;
  iterator __position;
  BN *in_RAX;
  unsigned_short *puVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  bool bVar3;
  int local_c;
  
  puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  bVar3 = puVar2 == __position._M_current;
  if (!bVar3) {
    *puVar2 = *puVar2 + 1;
    uVar1 = *puVar2;
    while (in_RAX = this, uVar1 == 0) {
      puVar2 = puVar2 + 1;
      bVar3 = puVar2 == __position._M_current;
      if (bVar3) break;
      *puVar2 = *puVar2 + 1;
      uVar1 = *puVar2;
    }
  }
  if (bVar3) {
    local_c = 1;
    if (__position._M_current ==
        (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_realloc_insert<int>
                (&this->ba,__position,&local_c);
      in_RAX = this;
    }
    else {
      *__position._M_current = 1;
      (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
      in_RAX = this;
    }
  }
  return in_RAX;
}

Assistant:

BN & BN::operator ++()
{
    for (auto& i : ba) {
        ++i;
        if (i != 0)
            return *this;
    }
    ba.emplace_back(1);
    return *this;
}